

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCircBufferedStream.cpp
# Opt level: O0

void __thiscall TPZCircBufferedStream::Print(TPZCircBufferedStream *this)

{
  undefined1 auVar1 [16];
  ostream *poVar2;
  void *pvVar3;
  ulong uVar4;
  long *in_RDI;
  uint i;
  double *temp;
  uint local_14;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"fSize=");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,in_RDI[5]);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (ulong)in_RDI[5] >> 3;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar4);
  (**(code **)(*in_RDI + 0x1c8))(in_RDI,pvVar3,in_RDI + 5);
  for (local_14 = 0; (ulong)local_14 < (ulong)in_RDI[5] >> 3; local_14 = local_14 + 1) {
    poVar2 = (ostream *)
             std::ostream::operator<<(&std::cout,*(double *)((long)pvVar3 + (ulong)local_14 * 8));
    std::operator<<(poVar2," ");
  }
  if (pvVar3 != (void *)0x0) {
    operator_delete__(pvVar3);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void TPZCircBufferedStream::Print() {
    std::cout << "fSize=" << fSize << std::endl;
    double *temp = new double[fSize / 8];
    ConstRead(reinterpret_cast<char *>(temp), fSize);
    for (unsigned int i = 0; i < fSize / 8; ++i) {
        std::cout << temp[i] << " ";
    }
	delete[] temp;
    std::cout << std::endl;
}